

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O0

void __thiscall
I2cAnalyzerResults::GenerateBubbleText
          (I2cAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  ostream *poVar1;
  char *pcVar2;
  string local_830 [32];
  stringstream local_810 [8];
  stringstream ss_2;
  ostream local_800 [376];
  char local_688 [8];
  char number_str_1 [128];
  allocator local_5e1;
  string local_5e0 [32];
  string local_5c0 [39];
  allocator local_599;
  string local_598 [32];
  string local_578 [39];
  allocator local_551;
  string local_550 [32];
  string local_530 [32];
  stringstream local_510 [8];
  stringstream ss_1;
  ostream local_500 [376];
  string local_388 [39];
  allocator local_361;
  string local_360 [32];
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [32];
  stringstream local_290 [8];
  stringstream ss;
  ostream local_280 [376];
  uint local_108;
  I2cDirection direction;
  char local_f8 [8];
  char number_str [128];
  char ack [32];
  Frame local_50 [8];
  Frame frame;
  ulong local_40;
  char local_30;
  byte local_2f;
  DisplayBase display_base_local;
  Channel *param_2_local;
  U64 frame_index_local;
  I2cAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  if ((local_2f & 1) == 0) {
    if ((local_2f & 2) == 0) {
      snprintf(number_str + 0x78,0x20,"NAK");
    }
    else {
      snprintf(number_str + 0x78,0x20,"Missing ACK/NAK");
    }
  }
  else {
    snprintf(number_str + 0x78,0x20,"ACK");
  }
  if (local_30 == '\0') {
    AnalyzerHelpers::GetNumberString(local_40 >> 1,display_base,7,local_f8,0x80);
    local_108 = (uint)((local_40 & 1) == 0);
    if (local_108 == 0) {
      std::__cxx11::stringstream::stringstream(local_290);
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      poVar1 = std::operator<<(local_280,"R[");
      poVar1 = std::operator<<(poVar1,local_f8);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"",&local_2d1);
      std::__cxx11::stringstream::str((string *)local_290);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      poVar1 = std::operator<<(local_280,"Read [");
      poVar1 = std::operator<<(poVar1,local_f8);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"",&local_319);
      std::__cxx11::stringstream::str((string *)local_290);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      poVar1 = std::operator<<(local_280,"Read [");
      poVar1 = std::operator<<(poVar1,local_f8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,"",&local_361);
      std::__cxx11::stringstream::str((string *)local_290);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      poVar1 = std::operator<<(local_280,"Setup Read to [");
      poVar1 = std::operator<<(poVar1,local_f8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::stringstream::~stringstream(local_290);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_510);
      poVar1 = std::operator<<(local_500,"W[");
      poVar1 = std::operator<<(poVar1,local_f8);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_550,"",&local_551);
      std::__cxx11::stringstream::str((string *)local_510);
      std::__cxx11::string::~string(local_550);
      std::allocator<char>::~allocator((allocator<char> *)&local_551);
      poVar1 = std::operator<<(local_500,"Write [");
      poVar1 = std::operator<<(poVar1,local_f8);
      std::operator<<(poVar1,"]");
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_578);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_598,"",&local_599);
      std::__cxx11::stringstream::str((string *)local_510);
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
      poVar1 = std::operator<<(local_500,"Write [");
      poVar1 = std::operator<<(poVar1,local_f8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,"",&local_5e1);
      std::__cxx11::stringstream::str((string *)local_510);
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      poVar1 = std::operator<<(local_500,"Setup Write to [");
      poVar1 = std::operator<<(poVar1,local_f8);
      poVar1 = std::operator<<(poVar1,"] + ");
      std::operator<<(poVar1,number_str + 0x78);
      std::__cxx11::stringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AnalyzerResults::AddResultString
                ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)(number_str_1 + 0x78));
      std::__cxx11::stringstream::~stringstream(local_510);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(local_40,display_base,8,local_688,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,local_688,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::stringstream(local_810);
    poVar1 = std::operator<<(local_800,local_688);
    poVar1 = std::operator<<(poVar1," + ");
    std::operator<<(poVar1,number_str + 0x78);
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString
              ((char *)this,pcVar2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_830);
    std::__cxx11::stringstream::~stringstream(local_810);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            AddResultString( "R" );

            ss << "R[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Read [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "W[" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "]";
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Write [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
            ss.str( "" );

            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddResultString( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        AddResultString( number_str );

        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddResultString( ss.str().c_str() );
    }
}